

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O1

void __thiscall
Logger<(Log)0>::createMessage<unsigned_long&,unsigned_long&>
          (Logger<(Log)0> *this,stringstream *msg,char *fmt,unsigned_long *arg,unsigned_long *args)

{
  char cVar1;
  char local_41;
  Logger<(Log)0> *local_40;
  unsigned_long *local_38;
  
  cVar1 = *fmt;
  local_40 = this;
  local_38 = args;
  if (cVar1 != '%') {
    do {
      if (cVar1 == '\0') {
        return;
      }
      if (cVar1 == '\\') break;
      local_41 = cVar1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(msg + 0x10),&local_41,1);
      fmt = fmt + 1;
      cVar1 = *fmt;
    } while (cVar1 != '%');
  }
  std::ostream::_M_insert<unsigned_long>((ulong)(msg + 0x10));
  createMessage<unsigned_long&>(local_40,msg,fmt + 1,local_38);
  return;
}

Assistant:

void createMessage(std::stringstream& msg, const char* fmt, 
                                                  Arg1&& arg, Args&&... args)
     {
       bool doSkipNext = false;
       while (*fmt != '%' && !doSkipNext)
       {
         doSkipNext = false;
         //Make sure we're not running past the end of our formatting string.
         if (*fmt == '\0')
           return;
           
         if (*fmt == '\\')
         { //Escape for the %sign
           doSkipNext = true;
         }
         else
         {
           msg << *fmt;
           fmt++;
         }
       }

       fmt++; //Consume the % sign
       msg << arg;
       createMessage(msg, fmt, args...); //and recursively call ourselve / the method below.
     }